

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderTextClippedEx
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,char *text,
               char *text_display_end,ImVec2 *text_size_if_known,ImVec2 *align,ImRect *clip_rect)

{
  bool bVar1;
  ImU32 IVar2;
  float fVar3;
  bool local_81;
  ImVec2 *local_80;
  undefined1 local_6c [8];
  ImVec4 fine_clip_rect;
  bool need_clipping;
  ImVec2 *clip_max;
  ImVec2 *clip_min;
  ImVec2 text_size;
  ImVec2 pos;
  ImVec2 *text_size_if_known_local;
  char *text_display_end_local;
  char *text_local;
  ImVec2 *pos_max_local;
  ImVec2 *pos_min_local;
  ImDrawList *draw_list_local;
  
  text_size = *pos_min;
  if (text_size_if_known == (ImVec2 *)0x0) {
    clip_min = (ImVec2 *)CalcTextSize(text,text_display_end,false,0.0);
  }
  else {
    clip_min = *(ImVec2 **)text_size_if_known;
  }
  local_80 = pos_max;
  if (clip_rect != (ImRect *)0x0) {
    local_80 = &clip_rect->Max;
    pos_min = &clip_rect->Min;
  }
  stack0xffffffffffffffa8 = local_80;
  local_81 = true;
  if (text_size.x + clip_min._0_4_ < local_80->x) {
    local_81 = local_80->y <= text_size.y + clip_min._4_4_;
  }
  fine_clip_rect.z._3_1_ = local_81;
  if (clip_rect != (ImRect *)0x0) {
    bVar1 = true;
    if ((((ImRect *)pos_min)->Min).x <= text_size.x) {
      bVar1 = text_size.y < (((ImRect *)pos_min)->Min).y;
    }
    fine_clip_rect.z._3_1_ = local_81 != false || bVar1;
  }
  if (0.0 < align->x) {
    fVar3 = ImMax<float>(text_size.x,
                         ((pos_max->x - text_size.x) - clip_min._0_4_) * align->x + text_size.x);
    text_size.x = fVar3;
  }
  if (0.0 < align->y) {
    fVar3 = ImMax<float>(text_size.y,
                         ((pos_max->y - text_size.y) - clip_min._4_4_) * align->y + text_size.y);
    text_size.y = fVar3;
  }
  if ((fine_clip_rect.z._3_1_ & 1) == 0) {
    IVar2 = GetColorU32(0,1.0);
    ImDrawList::AddText(draw_list,(ImFont *)0x0,0.0,&text_size,IVar2,text,text_display_end,0.0,
                        (ImVec4 *)0x0);
  }
  else {
    ImVec4::ImVec4((ImVec4 *)local_6c,(((ImRect *)pos_min)->Min).x,(((ImRect *)pos_min)->Min).y,
                   stack0xffffffffffffffa8->x,stack0xffffffffffffffa8->y);
    IVar2 = GetColorU32(0,1.0);
    ImDrawList::AddText(draw_list,(ImFont *)0x0,0.0,&text_size,IVar2,text,text_display_end,0.0,
                        (ImVec4 *)local_6c);
  }
  return;
}

Assistant:

void ImGui::RenderTextClippedEx(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_display_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Perform CPU side clipping for single clipped element to avoid using scissor state
    ImVec2 pos = pos_min;
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_display_end, false, 0.0f);

    const ImVec2* clip_min = clip_rect ? &clip_rect->Min : &pos_min;
    const ImVec2* clip_max = clip_rect ? &clip_rect->Max : &pos_max;
    bool need_clipping = (pos.x + text_size.x >= clip_max->x) || (pos.y + text_size.y >= clip_max->y);
    if (clip_rect) // If we had no explicit clipping rectangle then pos==clip_min
        need_clipping |= (pos.x < clip_min->x) || (pos.y < clip_min->y);

    // Align whole block. We should defer that to the better rendering function when we'll have support for individual line alignment.
    if (align.x > 0.0f) pos.x = ImMax(pos.x, pos.x + (pos_max.x - pos.x - text_size.x) * align.x);
    if (align.y > 0.0f) pos.y = ImMax(pos.y, pos.y + (pos_max.y - pos.y - text_size.y) * align.y);

    // Render
    if (need_clipping)
    {
        ImVec4 fine_clip_rect(clip_min->x, clip_min->y, clip_max->x, clip_max->y);
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, &fine_clip_rect);
    }
    else
    {
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, NULL);
    }
}